

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_gej *a;
  void *pvVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_ge q;
  secp256k1_fe xr;
  secp256k1_scalar m;
  uchar c [32];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej local_128;
  secp256k1_gej pubkeyj;
  
  if (msghash32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msghash32 != NULL";
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig != NULL";
  }
  else {
    if (pubkey != (secp256k1_pubkey *)0x0) {
      secp256k1_scalar_set_b32(&m,msghash32,(int *)0x0);
      r.d[0] = *(uint64_t *)sig->data;
      r.d[1] = *(uint64_t *)(sig->data + 8);
      r.d[2] = *(uint64_t *)(sig->data + 0x10);
      r.d[3] = *(uint64_t *)(sig->data + 0x18);
      s.d[0] = *(uint64_t *)(sig->data + 0x20);
      s.d[1] = *(uint64_t *)(sig->data + 0x28);
      s.d[2] = *(uint64_t *)(sig->data + 0x30);
      s.d[3] = *(uint64_t *)(sig->data + 0x38);
      iVar1 = secp256k1_scalar_is_high(&s);
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&q,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      auVar4._0_4_ = -(uint)((int)r.d[0] == 0 && (int)r.d[2] == 0);
      auVar4._4_4_ = -(uint)(r.d[0]._4_4_ == 0 && r.d[2]._4_4_ == 0);
      auVar4._8_4_ = -(uint)((int)r.d[1] == 0 && (int)r.d[3] == 0);
      auVar4._12_4_ = -(uint)(r.d[1]._4_4_ == 0 && r.d[3]._4_4_ == 0);
      iVar1 = movmskps(iVar1,auVar4);
      if (iVar1 == 0xf) {
        return 0;
      }
      if ((s.d[1] == 0 && s.d[3] == 0) && (s.d[0] == 0 && s.d[2] == 0)) {
        return 0;
      }
      secp256k1_scalar_inverse_var(&sn,&s);
      secp256k1_scalar_mul(&u1,&sn,&m);
      secp256k1_scalar_mul(&u2,&sn,&r);
      pubkeyj.infinity = q.infinity;
      pubkeyj.x.n[0] = q.x.n[0];
      pubkeyj.x.n[1] = q.x.n[1];
      pubkeyj.x.n[2] = q.x.n[2];
      pubkeyj.x.n[3] = q.x.n[3];
      pubkeyj.x.n[4] = q.x.n[4];
      pubkeyj.y.n[0] = q.y.n[0];
      pubkeyj.y.n[1] = q.y.n[1];
      pubkeyj.y.n[2] = q.y.n[2];
      pubkeyj.y.n[3] = q.y.n[3];
      pubkeyj.y.n[4] = q.y.n[4];
      pubkeyj.z.n[0] = 1;
      pubkeyj.z.n[1] = 0;
      pubkeyj.z.n[2] = 0;
      pubkeyj.z.n[3] = 0;
      pubkeyj.z.n[4] = 0;
      secp256k1_ecmult(&local_128,&pubkeyj,&u2,&u1);
      if (local_128.infinity != 0) {
        return 0;
      }
      secp256k1_scalar_get_b32(c,&r);
      secp256k1_fe_impl_set_b32_limit(&xr,c);
      a = &local_128;
      iVar1 = secp256k1_gej_eq_x_var(&xr,a);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = secp256k1_fe_impl_cmp_var(&xr,&a->x);
      if (-1 < iVar1) {
        return 0;
      }
      secp256k1_fe_impl_add(&xr,&secp256k1_ecdsa_const_order_as_fe);
      iVar1 = secp256k1_gej_eq_x_var(&xr,&local_128);
      return iVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}